

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

int Sle_ManComputeDelayOne(Gia_Man_t *p,int iObj,Vec_Int_t *vCuts,Vec_Int_t *vTime)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  
  iVar1 = Vec_IntEntry(vCuts,iObj);
  puVar3 = (uint *)Vec_IntEntryP(vCuts,iVar1);
  iVar1 = 1000000000;
  puVar4 = puVar3;
  for (iVar5 = 0; puVar4 = puVar4 + 1, iVar5 < (int)*puVar3; iVar5 = iVar5 + 1) {
    iVar2 = Sle_ManComputeDelayCut((Gia_Man_t *)vCuts,(int *)puVar4,vTime);
    if (iVar2 <= iVar1) {
      iVar1 = iVar2;
    }
    puVar4 = puVar4 + (*puVar4 & 0xf);
  }
  Vec_IntWriteEntry(vTime,iObj,iVar1);
  return iVar1;
}

Assistant:

int Sle_ManComputeDelayOne( Gia_Man_t * p, int iObj, Vec_Int_t * vCuts, Vec_Int_t * vTime )
{
    int i, * pCut, Delay, DelayMin = ABC_INFINITY;
    int * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    Sle_ForEachCut( pList, pCut, i )
    {
        Delay = Sle_ManComputeDelayCut( p, pCut, vTime );
        DelayMin = Abc_MinInt( DelayMin, Delay );
    }
    Vec_IntWriteEntry( vTime, iObj, DelayMin );
    return DelayMin;
}